

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrFunc<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  uint uVar1;
  void *pvVar2;
  uint32 index;
  Var *arr;
  OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  pvVar2 = GetRegRawPtr<unsigned_short>(this,playout->Instance);
  uVar1 = GetRegRawInt<unsigned_short>(this,playout->SlotIndex);
  SetRegRawPtr<unsigned_short>(this,playout->Value,*(void **)((long)pvVar2 + (ulong)uVar1 * 8));
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrFunc(const unaligned T* playout)
    {
        Var* arr = (Var*)GetRegRawPtr(playout->Instance);
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        SetRegRawPtr(playout->Value, arr[index]);
    }